

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O2

uint32 get32(vorb *f)

{
  uint8 uVar1;
  uint8 uVar2;
  uint8 uVar3;
  uint8 uVar4;
  
  uVar1 = get8(f);
  uVar2 = get8(f);
  uVar3 = get8(f);
  uVar4 = get8(f);
  return CONCAT13(uVar4,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
}

Assistant:

static uint32 get32(vorb *f)
{
   uint32 x;
   x = get8(f);
   x += get8(f) << 8;
   x += get8(f) << 16;
   x += (uint32) get8(f) << 24;
   return x;
}